

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ulong start;
  string local_48;
  
  sVar2 = s->_M_string_length;
  if (sVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar3 = (s->_M_dataplus)._M_p;
    start = 0;
    do {
      if ((start < sVar2 - 3) && (pcVar3[start] == '&')) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar3,pcVar3 + sVar2);
        DecodeRemaining(__return_storage_ptr__,this,&local_48,start);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      start = start + 1;
    } while (sVar2 != start);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (s->_M_dataplus)._M_p;
    paVar1 = &s->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = s->_M_string_length;
    (s->_M_dataplus)._M_p = (pointer)paVar1;
    s->_M_string_length = 0;
    (s->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    size_t length = s.length();

    for (size_t i = 0; i < length; i++)
    {
        char c = s.at(i);

        if (c == '&' && i < length - 3)
        {
            return DecodeRemaining(s, i);
        }
    }

    return s;
}